

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O1

void __thiscall
chrono::ChQuadratureTablesTriangle::ChQuadratureTablesTriangle(ChQuadratureTablesTriangle *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  vector<double,_std::allocator<double>_> wt;
  vector<double,_std::allocator<double>_> ya;
  vector<double,_std::allocator<double>_> wt_2;
  vector<double,_std::allocator<double>_> xa;
  allocator_type local_b9;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  this_00 = &this->LrootsU;
  this_01 = &this->LrootsV;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555555;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_58,__l,(allocator_type *)&local_b8);
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555555;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_00,(allocator_type *)&local_78)
  ;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3ff0000000000000;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_01,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&local_b8);
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fc55555555555cd;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fc55555555555cd;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe5555555555573;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_58,__l_02,(allocator_type *)&local_b8)
  ;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fc55555555555cd;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe5555555555573;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc55555555555cd;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_b8;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_03,(allocator_type *)&local_78)
  ;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555519;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fd5555555555519;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd5555555555519;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_04,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&local_b8);
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555519;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fc999999999999a;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc999999999999a;
  uStack_40 = 0x3fe3333333333333;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_05,(allocator_type *)&local_b8)
  ;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555519;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fc999999999999a;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe3333333333333;
  uStack_40 = 0x3fc999999999999a;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_06,(allocator_type *)&local_78)
  ;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbfe2000000000000;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe0aaaaaaaaaa8d;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe0aaaaaaaaaa8d;
  uStack_40 = 0x3fe0aaaaaaaaaa8d;
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_07,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&local_b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&local_78);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uStack_38 = 0x3fb77189ea1db092;
  uStack_30 = 0x3fea239d857893db;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fdc8a6b8a0bd136;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fdc8a6b8a0bd136;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fbbaca3afa17920;
  uStack_40 = 0x3fb77189ea1db092;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_08,(allocator_type *)&local_b8)
  ;
  uStack_38 = 0x3fea239d857893db;
  uStack_30 = 0x3fb77189ea1db092;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fdc8a6b8a0bd136;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fbbaca3afa17920;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fdc8a6b8a0bd136;
  uStack_40 = 0x3fb77189ea1db092;
  __l_09._M_len = 6;
  __l_09._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_09,(allocator_type *)&local_78)
  ;
  uStack_38 = 0x3fbc25cc27234537;
  uStack_30 = 0x3fbc25cc27234537;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fcc97c497190797;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fcc97c497190797;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fcc97c497190797;
  uStack_40 = 0x3fbc25cc27234537;
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_10,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&local_b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&local_78);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uStack_38 = 0x3fb9ede99c7af698;
  uStack_30 = 0x3fb9ede99c7af698;
  uStack_28 = 0x3fe9848598e142b4;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555519;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fde16cebd738b65;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fde16cebd738b65;
  uStack_40 = 0x3fae931428c74410;
  __l_11._M_len = 7;
  __l_11._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,__l_11,(allocator_type *)&local_b8)
  ;
  uStack_38 = 0x3fb9ede99c7af698;
  uStack_30 = 0x3fe9848598e142b4;
  uStack_28 = 0x3fb9ede99c7af698;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd5555555555519;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fde16cebd738b65;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fae931428c74410;
  uStack_40 = 0x3fde16cebd738b65;
  __l_12._M_len = 7;
  __l_12._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_12,(allocator_type *)&local_78)
  ;
  uStack_38 = 0x3fc01ec66adccf90;
  uStack_30 = 0x3fc01ec66adccf90;
  uStack_28 = 0x3fc01ec66adccf90;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fcccccccccccccd;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fc0f24aa6344271;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc0f24aa6344271;
  uStack_40 = 0x3fc0f24aa6344271;
  __l_13._M_len = 7;
  __l_13._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__l_13,&local_b9);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&local_b8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&local_78);
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ChQuadratureTablesTriangle::ChQuadratureTablesTriangle() {
    // initialize table with precomputed weights and coordinates
    {  // i=0: 1pt  deg 1
        std::vector<double> xa= {1./3.};
        std::vector<double> ya= {1./3.};
        std::vector<double> wt= {1};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
    {  // i=1: 3pt  deg 2
        std::vector<double> xa= {0.166666666666670,   0.166666666666670,   0.666666666666670};
        std::vector<double> ya= {0.166666666666670,   0.666666666666670,   0.166666666666670};
        std::vector<double> wt= {0.333333333333330,   0.333333333333330,   0.333333333333330};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt); 
    }
    {   // i=2: 4pt  deg 3
        std::vector<double> xa= {0.333333333333330,  0.200000000000000,   0.200000000000000,  0.600000000000000};
        std::vector<double> ya= {0.333333333333330,  0.200000000000000,   0.600000000000000,  0.200000000000000};
        std::vector<double> wt= {-0.56250000000000,  0.520833333333330,   0.520833333333330,  0.520833333333330};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt); 
    }
    {   // i=3: 6pt  deg  4
        std::vector<double> xa= {0.445948490915970,   0.445948490915970,   0.108103018168070,   0.091576213509770,   0.091576213509770,   0.816847572980460};
        std::vector<double> ya= {0.445948490915970,   0.108103018168070,   0.445948490915970,   0.091576213509770,   0.816847572980460,   0.091576213509770};
        std::vector<double> wt= {0.223381589678010,   0.223381589678010,   0.223381589678010,   0.109951743655320,   0.109951743655320,   0.109951743655320};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
    {   // i=4: 7 pt deg 5
        std::vector<double> xa= {0.333333333333330,   0.470142064105110,   0.470142064105110,   0.059715871789770,   0.101286507323460,   0.101286507323460,   0.797426985353090};
        std::vector<double> ya= {0.333333333333330,   0.470142064105110,   0.059715871789770,   0.470142064105110,   0.101286507323460,   0.797426985353090,   0.101286507323460};
        std::vector<double> wt= {0.225000000000000,   0.132394152788510,   0.132394152788510,   0.132394152788510,   0.125939180544830,   0.125939180544830,   0.125939180544830};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->Weight.push_back(wt);
    }
}